

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_remove_back_n(void)

{
  reference piVar1;
  undefined4 local_5c [2];
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44 [2];
  undefined4 local_3c;
  size_type local_38 [2];
  undefined1 local_28 [8];
  span<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.tail = (pointer)0x160000000b;
  vista::span<int,_18446744073709551615UL>::span<4UL,_0>
            ((span<int,_18446744073709551615UL> *)local_28,(element_type (*) [4])&span.member.tail);
  local_38[0] = vista::span<int,_18446744073709551615UL>::size
                          ((span<int,_18446744073709551615UL> *)local_28);
  local_3c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf1,"void api_dynamic_suite::dynamic_remove_back_n()",local_38,&local_3c);
  piVar1 = vista::span<int,_18446744073709551615UL>::back
                     ((span<int,_18446744073709551615UL> *)local_28);
  local_44[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf2,"void api_dynamic_suite::dynamic_remove_back_n()",piVar1,local_44);
  vista::span<int,_18446744073709551615UL>::remove_back<true,_0>
            ((span<int,_18446744073709551615UL> *)local_28,2);
  local_50 = vista::span<int,_18446744073709551615UL>::size
                       ((span<int,_18446744073709551615UL> *)local_28);
  local_54 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf4,"void api_dynamic_suite::dynamic_remove_back_n()",&local_50,&local_54);
  piVar1 = vista::span<int,_18446744073709551615UL>::back
                     ((span<int,_18446744073709551615UL> *)local_28);
  local_5c[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.back()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xf5,"void api_dynamic_suite::dynamic_remove_back_n()",piVar1,local_5c);
  return;
}

Assistant:

void dynamic_remove_back_n()
{
    int array[4] = { 11, 22, 33, 44 };
    vista::span<int> span(array);
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.back(), 44);
    span.remove_back(2);
    BOOST_TEST_EQ(span.size(), 2);
    BOOST_TEST_EQ(span.back(), 22);
}